

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sections.cpp
# Opt level: O3

void __thiscall ast::Section::write16(Section *this,uint offset,uint16_t value)

{
  uint new_capacity;
  
  new_capacity = offset + 2;
  if (this->content_capacity < new_capacity) {
    enlarge(this,new_capacity);
  }
  this->content[offset] = (uint8_t)value;
  this->content[offset + 1] = (uint8_t)(value >> 8);
  if (this->content_size <= new_capacity) {
    this->content_size = new_capacity;
  }
  return;
}

Assistant:

void Section::write16(unsigned offset, uint16_t value)
{
	auto limit_superior = offset + 2;
	if (limit_superior > content_capacity)
		enlarge(limit_superior);
	content[offset]     = static_cast<uint8_t >(value);
	content[offset + 1] = static_cast<uint8_t >(value >> 8);
	if (limit_superior >= content_size)
		content_size = offset + 2;
}